

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O2

uint16_t wirehair::GeneratePeelRowWeight(uint32_t rv,uint16_t block_count)

{
  uint16_t uVar1;
  ushort uVar2;
  ulong uVar3;
  
  if (block_count < 0x801) {
    if (rv < 0x1ffffff) {
      return 1;
    }
    rv = rv + 0xfe000001;
  }
  uVar1 = 2;
  if (((int)rv < 0) && (uVar1 = 3, 0xaaaaaaa9 < rv)) {
    uVar2 = 3;
    do {
      uVar1 = uVar2 + 1;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar1;
    } while (*(uint *)(kPeelCountDistribution + uVar3 * 4) < rv);
  }
  return uVar1;
}

Assistant:

uint16_t GeneratePeelRowWeight(
    uint32_t rv, ///< 32-bit random value
    uint16_t block_count ///< Number of input blocks
)
{
    // If peel column count is small:
    if (block_count <= kMaxNForWeight1)
    {
        if (rv < P1) {
            return 1;
        }

        // Rescale to match table values
        rv -= P1;
    }

    // Unroll first 3 for speed (common case):

    if (rv <= P2) {
        return 2;
    }

    if (rv <= P3) {
        return 3;
    }

    uint16_t weight = 3;

    // Find first table entry containing a number smaller than or equal to rv
    while (rv > kPeelCountDistribution[weight++])
    {
        CAT_DEBUG_ASSERT(weight < kMaxPeelCount);
    }

    return weight;
}